

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

ssize_t __thiscall Arcflow::read(Arcflow *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 uVar1;
  int iVar2;
  runtime_error *prVar3;
  clock_t cVar4;
  reference pvVar5;
  undefined4 in_register_00000034;
  char local_1138 [8];
  char _error_msg__15 [256];
  char _error_msg__14 [256];
  char local_f28 [8];
  char _error_msg__13 [256];
  int label;
  int i_v;
  int i_u;
  int i_1;
  char _error_msg__12 [256];
  char _error_msg__11 [256];
  char _error_msg__10 [256];
  char _error_msg__9 [256];
  char _error_msg__8 [256];
  char _error_msg__7 [256];
  char _error_msg__6 [256];
  int local_70c;
  char local_708 [4];
  int i;
  char _error_msg__5 [256];
  char _error_msg__4 [256];
  char _error_msg__3 [256];
  char _error_msg__2 [256];
  int local_2fc;
  char local_2f8 [4];
  int nbtypes;
  char _error_msg__1 [256];
  Instance local_1f0;
  char local_118 [8];
  char _error_msg_ [256];
  FILE *fin_local;
  Arcflow *this_local;
  
  _error_msg_._252_4_ = in_register_00000034;
  _error_msg_._248_4_ = __fd;
  if ((this->ready & 1U) != 0) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x23c);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,local_118);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar4 = clock();
  this->tstart = cVar4;
  Instance::Instance(&local_1f0,(FILE *)_error_msg_._248_8_,MVP);
  Instance::operator=(&this->inst,&local_1f0);
  Instance::~Instance(&local_1f0);
  iVar2 = __isoc99_fscanf(_error_msg_._248_8_," #GRAPH_BEGIN#");
  if (iVar2 != 0) {
    snprintf(local_2f8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" #GRAPH_BEGIN#\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x23f);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,local_2f8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = __isoc99_fscanf(_error_msg_._248_8_," $NBTYPES { %d } ;",&local_2fc);
  if (iVar2 != 1) {
    snprintf(_error_msg__3 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" $NBTYPES { %d } ;\", &nbtypes) == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x242);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,_error_msg__3 + 0xf8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_2fc != (this->inst).nbtypes) {
    snprintf(_error_msg__4 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "nbtypes == inst.nbtypes",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x243);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,_error_msg__4 + 0xf8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = __isoc99_fscanf(_error_msg_._248_8_," $S { %d } ;",&this->S);
  if (iVar2 != 1) {
    snprintf(_error_msg__5 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" $S { %d } ;\", &S) == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x245);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,_error_msg__5 + 0xf8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->Ts,(long)local_2fc);
  iVar2 = __isoc99_fscanf(_error_msg_._248_8_," $Ts { ");
  if (iVar2 != 0) {
    snprintf(local_708,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" $Ts { \") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x248);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,local_708);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  for (local_70c = 0; local_70c < local_2fc; local_70c = local_70c + 1) {
    if ((local_70c != 0) && (iVar2 = __isoc99_fscanf(_error_msg_._248_8_," ,"), iVar2 != 0)) {
      snprintf(_error_msg__7 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \" ,\") == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x24a);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,_error_msg__7 + 0xf8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = _error_msg_._248_8_;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,(long)local_70c);
    iVar2 = __isoc99_fscanf(uVar1,"%d",pvVar5);
    if (iVar2 != 1) {
      snprintf(_error_msg__8 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \"%d\", &Ts[i]) == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x24b);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,_error_msg__8 + 0xf8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  iVar2 = __isoc99_fscanf(_error_msg_._248_8_," } ;");
  if (iVar2 != 0) {
    snprintf(_error_msg__9 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" } ;\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x24d);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,_error_msg__9 + 0xf8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = __isoc99_fscanf(_error_msg_._248_8_," $LOSS { %d } ;",&this->LOSS);
  if (iVar2 == 1) {
    iVar2 = __isoc99_fscanf(_error_msg_._248_8_," $NV { %d } ;",&this->NV);
    if (iVar2 != 1) {
      snprintf(_error_msg__11 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d"
               ,"fscanf(fin, \" $NV { %d } ;\", &NV) == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x251);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,_error_msg__11 + 0xf8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = __isoc99_fscanf(_error_msg_._248_8_," $NA { %d } ;",&this->NA);
    if (iVar2 != 1) {
      snprintf(_error_msg__12 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d"
               ,"fscanf(fin, \" $NA { %d } ;\", &NA) == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x253);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,_error_msg__12 + 0xf8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = __isoc99_fscanf(_error_msg_._248_8_," $ARCS {");
    if (iVar2 != 0) {
      snprintf((char *)&i_u,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \" $ARCS {\") == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x255);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,(char *)&i_u);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (i_v = 0; i_v < this->NA; i_v = i_v + 1) {
      iVar2 = __isoc99_fscanf(_error_msg_._248_8_," %d %d %d ",&label,_error_msg__13 + 0xfc,
                              _error_msg__13 + 0xf8);
      if (iVar2 != 3) {
        snprintf(local_f28,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \" %d %d %d \", &i_u, &i_v, &label) == 3",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,600);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,local_f28);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Arc::Arc((Arc *)(_error_msg__14 + 0xfc),&label,(int *)(_error_msg__13 + 0xfc),
               _error_msg__13._248_4_);
      std::vector<Arc,_std::allocator<Arc>_>::push_back
                (&this->A,(value_type *)(_error_msg__14 + 0xfc));
    }
    iVar2 = __isoc99_fscanf(_error_msg_._248_8_," } ;");
    if (iVar2 == 0) {
      iVar2 = __isoc99_fscanf(_error_msg_._248_8_," #GRAPH_END#");
      if (iVar2 == 0) {
        this->ready = true;
        return (ssize_t)this;
      }
      snprintf(local_1138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \" #GRAPH_END#\") == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x25c);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,local_1138);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    snprintf(_error_msg__15 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" } ;\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x25b);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,_error_msg__15 + 0xf8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  snprintf(_error_msg__10 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "fscanf(fin, \" $LOSS { %d } ;\", &LOSS) == 1",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x24f);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,_error_msg__10 + 0xf8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::read(FILE *fin) {
	throw_assert(ready == false);
	tstart = CURTIME;
	inst = Instance(fin);
	throw_assert(fscanf(fin, " #GRAPH_BEGIN#") == 0);

	int nbtypes;
	throw_assert(fscanf(fin, " $NBTYPES { %d } ;", &nbtypes) == 1);
	throw_assert(nbtypes == inst.nbtypes);

	throw_assert(fscanf(fin, " $S { %d } ;", &S) == 1);

	Ts.resize(nbtypes);
	throw_assert(fscanf(fin, " $Ts { ") == 0);
	for (int i = 0; i < nbtypes; i++) {
		if (i) throw_assert(fscanf(fin, " ,") == 0);
		throw_assert(fscanf(fin, "%d", &Ts[i]) == 1);
	}
	throw_assert(fscanf(fin, " } ;") == 0);

	throw_assert(fscanf(fin, " $LOSS { %d } ;", &LOSS) == 1);

	throw_assert(fscanf(fin, " $NV { %d } ;", &NV) == 1);

	throw_assert(fscanf(fin, " $NA { %d } ;", &NA) == 1);

	throw_assert(fscanf(fin, " $ARCS {") == 0);
	for (int i = 0; i < NA; i++) {
		int i_u, i_v, label;
		throw_assert(fscanf(fin, " %d %d %d ", &i_u, &i_v, &label) == 3);
		A.push_back(Arc(i_u, i_v, label));
	}
	throw_assert(fscanf(fin, " } ;") == 0);
	throw_assert(fscanf(fin, " #GRAPH_END#") == 0);
	ready = true;
}